

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O3

void __thiscall
soplex::SVSetBase<double>::xtend(SVSetBase<double> *this,SVectorBase<double> *svec,int newmax)

{
  IdList<soplex::SVSetBase<double>::DLPSV> *this_00;
  int *piVar1;
  int iVar2;
  uint i;
  DLPSV *pDVar3;
  Nonzero<double> *pNVar4;
  Nonzero<double> *pNVar5;
  DLPSV *ps;
  int iVar6;
  ulong uVar7;
  Nonzero<double> *pNVar8;
  
  iVar6 = newmax - svec->memsize;
  if (iVar6 != 0 && svec->memsize <= newmax) {
    iVar2 = svec->memused;
    if ((this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last == (DLPSV *)svec) {
      ensureMem(this,iVar6,false);
      ClassArray<soplex::Nonzero<double>_>::insert
                (&this->super_ClassArray<soplex::Nonzero<double>_>,
                 (this->super_ClassArray<soplex::Nonzero<double>_>).thesize,newmax - svec->memsize);
      updateUnusedMemEstimation(this,iVar2 - svec->memsize);
    }
    else {
      this_00 = &this->list;
      ensureMem(this,newmax,true);
      i = (this->super_ClassArray<soplex::Nonzero<double>_>).thesize;
      uVar7 = 0;
      if (0 < (int)i) {
        uVar7 = (ulong)i;
      }
      pNVar8 = (this->super_ClassArray<soplex::Nonzero<double>_>).data + uVar7;
      ClassArray<soplex::Nonzero<double>_>::insert
                (&this->super_ClassArray<soplex::Nonzero<double>_>,i,newmax);
      iVar6 = svec->memused;
      if (iVar6 != 0) {
        pNVar4 = svec->m_elem;
        pNVar5 = pNVar8;
        do {
          if ((pNVar4->val != 0.0) || (NAN(pNVar4->val))) {
            pNVar5->idx = pNVar4->idx;
            pNVar5->val = pNVar4->val;
            pNVar5 = pNVar5 + 1;
          }
          iVar6 = iVar6 + -1;
          pNVar4 = pNVar4 + 1;
        } while (iVar6 != 0);
      }
      if ((this_00->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first != (DLPSV *)svec) {
        piVar1 = (int *)(*(long *)&svec[1].memsize + 8);
        *piVar1 = *piVar1 + svec->memsize;
      }
      updateUnusedMemEstimation(this,svec->memused);
      IdList<soplex::SVSetBase<double>::DLPSV>::remove(this_00,(char *)svec);
      pDVar3 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
      if (pDVar3 == (DLPSV *)0x0) {
        (this_00->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first = (DLPSV *)svec;
      }
      else {
        pDVar3->thenext = (DLPSV *)svec;
        *(DLPSV **)&svec[1].memsize =
             (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
      }
      (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last = (DLPSV *)svec;
      svec->m_elem = pNVar8;
    }
    svec->memsize = newmax;
    svec->memused = iVar2;
  }
  return;
}

Assistant:

void xtend(SVectorBase<R>& svec, int newmax)
   {
      if(svec.max() < newmax)
      {
         assert(has(&svec));

         DLPSV* ps = static_cast<DLPSV*>(&svec);
         int sz = ps->size();

         if(ps == list.last())
         {
            // because we want to extend the last vector we must not shrink its max memory usage
            // in order to ensure the missing memory
            ensureMem(newmax - ps->max(), false);
#ifndef NDEBUG
            Nonzero<R>* olddata = SVSetBaseArray::data;
            SVSetBaseArray::insert(memSize(), newmax - ps->max());
            assert(olddata == SVSetBaseArray::data);
#else
            SVSetBaseArray::insert(memSize(), newmax - ps->max());
#endif

            // decrease counter of unused memory (assume that new entries will be used)
#ifdef SOPLEX_DEBUG
            SPxOut::debug(this, "xtend (1), this = {} : updateUnusedMemEstimation -= {}\n", (void*)this,
                          ps->max() - sz);
#endif
            updateUnusedMemEstimation(sz - ps->max());

            ps->setMem(newmax, ps->mem());
            ps->set_size(sz);
         }
         else
         {
            ensureMem(newmax);
            SVectorBase<R> newps(0, nullptr);

            if(SVSetBaseArray::size() > 0)
               newps.setMem(newmax, &SVSetBaseArray::last() + 1);
            else
               newps.setMem(newmax, SVSetBaseArray::get_ptr());

#ifndef NDEBUG
            Nonzero<R>* olddata = SVSetBaseArray::data;
            SVSetBaseArray::insert(memSize(), newmax);
            assert(olddata == SVSetBaseArray::data);
#else
            SVSetBaseArray::insert(memSize(), newmax);
#endif

            newps = svec;

            if(ps != list.first())
            {
               SVectorBase<R>* prev = ps->prev();
               int prevsz = prev->size();
               prev->setMem(prev->max() + ps->max(), prev->mem());
               prev->set_size(prevsz);
            }

            // increase counter of unused memory (assume that new entries will be used)
#ifdef SOPLEX_DEBUG
            SPxOut::debug(this, "xtend (2), this = {} : updateUnusedMemEstimation += {}\n", (void*)this,
                          ps->size());
#endif
            updateUnusedMemEstimation(ps->size());

            list.remove(ps);
            list.append(ps);

            ps->setMem(newmax, newps.mem());
            ps->set_size(sz);
         }
      }
   }